

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::SetupTriangle(Codec *this)

{
  undefined1 auVar1 [64];
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  ushort uVar5;
  undefined2 uVar6;
  uint uVar7;
  uint uVar8;
  uint16_t *puVar9;
  uint8_t *puVar10;
  uint64_t *puVar11;
  bool bVar12;
  ushort uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  
  uVar13 = this->_dense_count + this->_defer_count;
  if (uVar13 != 0) {
    puVar9 = this->_pivots;
    auVar20 = vpbroadcastq_avx512f();
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar25 = vpmovsxbw_avx512bw(_DAT_001097a0);
    uVar17 = 0;
    auVar26 = vpbroadcastq_avx512f(ZEXT816(0x20));
    auVar27 = vpbroadcastw_avx512bw(ZEXT216(0x20));
    do {
      vpcmpuq_avx512f(auVar24,auVar20,2);
      vpcmpuq_avx512f(auVar23,auVar20,2);
      vpcmpuq_avx512f(auVar22,auVar20,2);
      vpcmpuq_avx512f(auVar21,auVar20,2);
      auVar1 = vmovdqu16_avx512bw(auVar25);
      *(undefined1 (*) [64])(puVar9 + uVar17) = auVar1;
      uVar17 = uVar17 + 0x20;
      auVar24 = vpaddq_avx512f(auVar24,auVar26);
      auVar23 = vpaddq_avx512f(auVar23,auVar26);
      auVar22 = vpaddq_avx512f(auVar22,auVar26);
      auVar21 = vpaddq_avx512f(auVar21,auVar26);
      auVar25 = vpaddw_avx512bw(auVar25,auVar27);
    } while ((uVar13 + 0x1f & 0xffffffe0) != uVar17);
  }
  this->_next_pivot = 0;
  this->_pivot_count = (uint)uVar13;
  if (this->_first_heavy_column == 0) {
    uVar16 = this->_pivot_count;
    uVar2 = this->_defer_count;
    uVar3 = this->_dense_count;
    if (0 < (long)(int)uVar16) {
      uVar13 = uVar3 + uVar2;
      uVar4 = this->_mix_count;
      uVar18 = (ulong)uVar16;
      uVar17 = (long)(int)uVar16;
      do {
        uVar15 = uVar17 - 1;
        puVar9 = this->_pivots;
        uVar5 = puVar9[uVar17 - 1];
        if (uVar13 <= uVar5) {
          if (this->_next_pivot <= uVar15) {
            uVar18 = (ulong)((int)uVar18 - 1);
            puVar9[uVar15] = puVar9[uVar18];
            puVar9[uVar18] = uVar5;
          }
          uVar16 = this->_first_heavy_column;
          uVar19 = (uint)(ushort)(uVar4 + uVar2);
          if (uVar16 < uVar19) {
            uVar7 = this->_heavy_pitch;
            puVar10 = this->_heavy_matrix;
            uVar8 = this->_ge_pitch;
            puVar11 = this->_ge_matrix;
            do {
              puVar10[(ulong)(uVar16 - this->_first_heavy_column) +
                      (ulong)(((uint)uVar5 - (uint)uVar13) * uVar7)] =
                   (puVar11[(ulong)(uVar5 * uVar8) + (ulong)(uVar16 >> 6)] >> ((ulong)uVar16 & 0x3f)
                   & 1) != 0;
              uVar16 = uVar16 + 1;
            } while (uVar19 != uVar16);
          }
        }
        uVar16 = (uint)uVar18;
        bVar12 = 1 < (long)uVar17;
        uVar17 = uVar15;
      } while (bVar12);
    }
    this->_first_heavy_pivot = uVar16;
    puVar9 = this->_pivots;
    uVar16 = this->_pivot_count;
    lVar14 = 0;
    do {
      uVar6 = this->_extra_count;
      puVar9[uVar16 + (int)lVar14] = uVar2 + uVar3 + (short)lVar14 + uVar6;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    this->_pivot_count = this->_pivot_count + 6;
    return;
  }
  return;
}

Assistant:

void Codec::SetupTriangle()
{
    CAT_IF_DUMP(cout << endl << "---- SetupTriangle ----" << endl << endl;)

    CAT_DEBUG_ASSERT((unsigned)_defer_count + (unsigned)_dense_count < 65536);
    const uint16_t pivot_count = _defer_count + _dense_count;

    // Initialize pivot array to just non-heavy rows
    for (uint16_t pivot_i = 0; pivot_i < pivot_count; ++pivot_i) {
        _pivots[pivot_i] = pivot_i;
    }

    // Set resume point to the first column
    _next_pivot = 0;
    _pivot_count = pivot_count;

    // If heavy rows are used right from the start:
    if (_first_heavy_column <= 0) {
        InsertHeavyRows();
    }
}